

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poisson.c
# Opt level: O2

double delXSqrdByDelZ(double **X,int i,int j,int z,double alpha,double delz)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  bVar4 = z == 1;
  dVar1 = X[i][j];
  dVar2 = X[(int)((uint)bVar4 + i)][(int)((uint)!bVar4 + j)];
  dVar3 = X[(int)(i - (uint)bVar4)][(int)(j - (uint)!bVar4)];
  dVar7 = (dVar2 + dVar1) * (dVar2 + dVar1) - (dVar3 + dVar1) * (dVar3 + dVar1);
  if ((alpha != 0.0) || (NAN(alpha))) {
    dVar9 = dVar3 * dVar3 - dVar1 * dVar1;
    dVar8 = dVar1 * dVar1 - dVar2 * dVar2;
    uVar5 = -(ulong)(dVar2 < -dVar1);
    uVar6 = -(ulong)(dVar3 < -dVar1);
    dVar7 = ((double)(~uVar5 & (ulong)dVar8 | (ulong)-dVar8 & uVar5) * alpha + dVar7) -
            (double)(~uVar6 & (ulong)dVar9 | (ulong)-dVar9 & uVar6) * alpha;
  }
  return dVar7 / (delz * 4.0);
}

Assistant:

REAL delXSqrdByDelZ (REAL **X, int i, int j, int z, REAL alpha, REAL delz)
{
	int dx = (z == DERIVE_BY_X) ? 1 : 0;
	int dy = 1-dx;
	delz *= 4;
	REAL df2dz = sqr(X[i][j] + X[i+dx][j+dy]) - sqr(X[i-dx][j-dy] + X[i][j]);
	if (alpha == 0)
		return df2dz/delz;
	REAL correctionTerm = sqr(X[i][j]) - sqr(X[i+dx][j+dy]);
	if (X[i+dx][j+dy] < -X[i][j])
		correctionTerm *= -1;
	df2dz += alpha*correctionTerm;
	correctionTerm = sqr(X[i-dx][j-dy]) - sqr(X[i][j]);
	if (X[i-dx][j-dy] < - X[i][j])
		correctionTerm *= -1;
	df2dz -= alpha*correctionTerm;
	return df2dz/delz;
}